

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

int Extra_ThreshSelectWeights8(word *t,int nVars,int *pW)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int Limit;
  int nMints;
  int Lmax;
  int Lmin;
  int m;
  int *pW_local;
  int nVars_local;
  word *t_local;
  
  iVar1 = 1 << ((byte)nVars & 0x1f);
  iVar2 = nVars + 1;
  if (nVars != 8) {
    __assert_fail("nVars == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddThresh.c"
                  ,0x130,"int Extra_ThreshSelectWeights8(word *, int, int *)");
  }
  pW[7] = 1;
  do {
    if (iVar2 < pW[7]) {
      return 0;
    }
    pW[6] = pW[7];
    while (pW[6] <= iVar2) {
      pW[5] = pW[6];
      while (pW[5] <= iVar2) {
        pW[4] = pW[5];
        while (pW[4] <= iVar2) {
          pW[3] = pW[4];
          while (pW[3] <= iVar2) {
            pW[2] = pW[3];
            while (pW[2] <= iVar2) {
              pW[1] = pW[2];
              while (pW[1] <= iVar2) {
                *pW = pW[1];
                while (*pW <= iVar2) {
                  nMints = 10000;
                  Limit = 0;
                  for (Lmax = 0; Lmax < iVar1; Lmax = Lmax + 1) {
                    iVar3 = Abc_TtGetBit(t,Lmax);
                    if (iVar3 == 0) {
                      iVar3 = Extra_ThreshWeightedSum(pW,8,Lmax);
                      Limit = Abc_MaxInt(Limit,iVar3);
                    }
                    else {
                      iVar3 = Extra_ThreshWeightedSum(pW,8,Lmax);
                      nMints = Abc_MinInt(nMints,iVar3);
                    }
                    if (nMints <= Limit) break;
                  }
                  if (iVar1 <= Lmax) {
                    if (Limit < nMints) {
                      return nMints;
                    }
                    __assert_fail("Lmax < Lmin",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddThresh.c"
                                  ,0x149,"int Extra_ThreshSelectWeights8(word *, int, int *)");
                  }
                  *pW = *pW + 1;
                }
                pW[1] = pW[1] + 1;
              }
              pW[2] = pW[2] + 1;
            }
            pW[3] = pW[3] + 1;
          }
          pW[4] = pW[4] + 1;
        }
        pW[5] = pW[5] + 1;
      }
      pW[6] = pW[6] + 1;
    }
    pW[7] = pW[7] + 1;
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights8(word * t, int nVars, int * pW) {
	int m, Lmin, Lmax, nMints = (1 << nVars), Limit = nVars + 1; // <<-- incomplete detection to save runtime!
	assert(nVars == 8);
	for (pW[7] = 1; pW[7] <= Limit; pW[7]++)
		for (pW[6] = pW[7]; pW[6] <= Limit; pW[6]++)
			for (pW[5] = pW[6]; pW[5] <= Limit; pW[5]++)
				for (pW[4] = pW[5]; pW[4] <= Limit; pW[4]++)
					for (pW[3] = pW[4]; pW[3] <= Limit; pW[3]++)
						for (pW[2] = pW[3]; pW[2] <= Limit; pW[2]++)
							for (pW[1] = pW[2]; pW[1] <= Limit; pW[1]++)
								for (pW[0] = pW[1]; pW[0] <= Limit; pW[0]++) {
									Lmin = 10000;
									Lmax = 0;
									for (m = 0; m < nMints; m++) {
										if (Abc_TtGetBit(t, m))
											Lmin = Abc_MinInt(Lmin,
													Extra_ThreshWeightedSum(pW,
															nVars, m));
										else
											Lmax = Abc_MaxInt(Lmax,
													Extra_ThreshWeightedSum(pW,
															nVars, m));
										if (Lmax >= Lmin)
											break;
									}
									if (m < nMints)
										continue;
									assert(Lmax < Lmin);
									return Lmin;
								}
	return 0;
}